

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormulaTransformer.cpp
# Opt level: O0

Formula * __thiscall Kernel::FormulaTransformer::applyBinary(FormulaTransformer *this,Formula *f)

{
  Connective con;
  Formula *f_00;
  BinaryFormula *pBVar1;
  Formula *pFVar2;
  BinaryFormula *pBVar3;
  Formula *in_RSI;
  Formula *newRight;
  Formula *newLeft;
  Formula *in_stack_ffffffffffffff98;
  BinaryFormula *in_stack_ffffffffffffffb0;
  Formula *in_stack_ffffffffffffffe0;
  Formula *local_8;
  
  Formula::left((Formula *)0x858de2);
  f_00 = apply((FormulaTransformer *)in_RSI,in_stack_ffffffffffffffe0);
  Formula::right((Formula *)0x858dfe);
  pBVar1 = (BinaryFormula *)apply((FormulaTransformer *)in_RSI,f_00);
  pFVar2 = Formula::left((Formula *)0x858e24);
  if ((f_00 != pFVar2) ||
     (pBVar3 = (BinaryFormula *)Formula::right((Formula *)0x858e45),
     in_stack_ffffffffffffffb0 = pBVar1, local_8 = in_RSI, pBVar1 != pBVar3)) {
    local_8 = (Formula *)BinaryFormula::operator_new(0x858e68);
    con = Formula::connective(in_RSI);
    BinaryFormula::BinaryFormula(in_stack_ffffffffffffffb0,con,local_8,in_stack_ffffffffffffff98);
  }
  return local_8;
}

Assistant:

Formula* FormulaTransformer::applyBinary(Formula* f)
{
  Formula* newLeft = apply(f->left());
  Formula* newRight = apply(f->right());
  if(newLeft==f->left() && newRight==f->right()) {
    return f;
  }
  return new BinaryFormula(f->connective(), newLeft, newRight);
}